

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

half __thiscall
Imf_3_2::DwaCompressor::LossyDctEncoderBase::quantize
          (LossyDctEncoderBase *this,half src,float errorTolerance)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t in_SI;
  LossyDctEncoderBase *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  int targetNumSetBits;
  unsigned_short *closest;
  int numSetBits;
  float srcFloat;
  half tmp;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint16_t *local_28;
  half local_16;
  float local_14;
  half local_4 [2];
  
  local_14 = in_XMM0_Da;
  local_4[0]._h = in_SI;
  fVar3 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar1 = Imath_3_2::half::bits(local_4);
  iVar2 = countSetBits(in_RDI,uVar1);
  uVar1 = Imath_3_2::half::bits(local_4);
  local_28 = (uint16_t *)(&closestData + (ulong)*(uint *)(closestDataOffset + (ulong)uVar1 * 4) * 2)
  ;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      return (half)local_4[0]._h;
    }
    Imath_3_2::half::setBits(&local_16,*local_28);
    fVar4 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    dVar5 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar4 - fVar3));
    if (SUB84(dVar5,0) < local_14) break;
    local_28 = local_28 + 1;
  }
  return (half)local_16._h;
}

Assistant:

half
DwaCompressor::LossyDctEncoderBase::quantize (half src, float errorTolerance)
{
    half                  tmp;
    float                 srcFloat   = (float) src;
    int                   numSetBits = countSetBits (src.bits ());
    const unsigned short* closest =
        closestData + closestDataOffset[src.bits ()];

    for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp.setBits (*closest);

        if (fabs ((float) tmp - srcFloat) < errorTolerance) return tmp;

        closest++;
    }

    return src;
}